

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O2

pin_t __thiscall
lsim::Simulator::assign_pin(Simulator *this,SimComponent *component,bool used_as_input)

{
  node_t node_id;
  pin_t result;
  Value local_2c;
  node_t local_28;
  pin_t local_24;
  
  local_24 = (pin_t)((ulong)((long)(this->m_pin_nodes).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_pin_nodes).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
  local_28 = assign_node(this,component,used_as_input);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->m_pin_nodes,&local_28);
  local_2c = VALUE_UNDEFINED;
  std::vector<lsim::Value,_std::allocator<lsim::Value>_>::emplace_back<lsim::Value>
            (&this->m_pin_values,&local_2c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&(this->m_node_metadata).
              super__Vector_base<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>._M_impl.
              super__Vector_impl_data._M_start[local_28].m_pins,&local_24);
  return local_24;
}

Assistant:

pin_t Simulator::assign_pin(SimComponent *component, bool used_as_input) {
    auto result = static_cast<pin_t>(m_pin_nodes.size());
	auto node_id = assign_node(component, used_as_input);
	m_pin_nodes.push_back(node_id);
    m_pin_values.push_back(VALUE_UNDEFINED);
	m_node_metadata[node_id].m_pins.push_back(result);
    return result;
}